

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_result.cpp
# Opt level: O1

void __thiscall
cpp_db::sqlite_result::sqlite_result(sqlite_result *this,shared_statement_ptr *stmt_in)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int iVar2;
  sqlite3_stmt *psVar3;
  int iVar4;
  int local_34;
  undefined8 local_30;
  
  (this->super_result_interface)._vptr_result_interface = (_func_int **)&PTR__sqlite_result_00116848
  ;
  (this->stmt).super___shared_ptr<cpp_db::statement_interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (stmt_in->super___shared_ptr<cpp_db::statement_interface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  p_Var1 = (stmt_in->super___shared_ptr<cpp_db::statement_interface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->stmt).super___shared_ptr<cpp_db::statement_interface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->row_status = 0x65;
  (this->column_names)._M_h._M_buckets = &(this->column_names)._M_h._M_single_bucket;
  (this->column_names)._M_h._M_bucket_count = 1;
  (this->column_names)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->column_names)._M_h._M_element_count = 0;
  (this->column_names)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->column_names)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->column_names)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (*(this->super_result_interface)._vptr_result_interface[4])(this);
  iVar4 = 0;
  while( true ) {
    local_34 = iVar4;
    iVar2 = (*(this->super_result_interface)._vptr_result_interface[2])(this);
    if (iVar2 <= iVar4) break;
    psVar3 = get_stmt_handle(this);
    local_30 = sqlite3_column_name(psVar3,local_34);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<char_const*,int&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->column_names,&local_30,&local_34);
    iVar4 = local_34 + 1;
  }
  return;
}

Assistant:

sqlite_result::sqlite_result(const shared_statement_ptr &stmt_in)
	: stmt(stmt_in)
    , row_status(SQLITE_DONE)
{
    move_next();
    for (int column = 0; column < get_column_count(); ++column)
		column_names.emplace(sqlite3_column_name(get_stmt_handle(), column), column);
}